

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

xml_output * attrTagX(char *name,QStringList *v,char *s)

{
  bool bVar1;
  QString *in_RCX;
  QListSpecialMethods<QString> *in_RDX;
  xml_output *in_RDI;
  long in_FS_OFFSET;
  QStringList temp;
  QList<QString> *in_stack_ffffffffffffff28;
  xml_output *this;
  xml_output *this_00;
  char *in_stack_ffffffffffffff68;
  QChar in_stack_ffffffffffffff7e;
  QChar local_5a [25];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  this_00 = in_RDI;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x2440ba);
  if (bVar1) {
    noxml();
  }
  else {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)in_RDI,in_stack_ffffffffffffff28);
    QString::QString((QString *)this,in_stack_ffffffffffffff68);
    QChar::QChar<char16_t,_true>(local_5a,L' ');
    QString::arg<const_char_*,_true>
              ((QString *)this_00,(char **)in_RDX,(int)((ulong)in_RCX >> 0x20),
               in_stack_ffffffffffffff7e);
    QList<QString>::append((QList<QString> *)in_RDI,(rvalue_ref)in_stack_ffffffffffffff28);
    QString::~QString((QString *)0x244178);
    QString::~QString((QString *)0x244185);
    QString::QString((QString *)this,in_stack_ffffffffffffff68);
    QString::QString((QString *)this,in_stack_ffffffffffffff68);
    QListSpecialMethods<QString>::join(in_RDX,in_RCX);
    tagValue((QString *)this,(QString *)in_RDI);
    QString::~QString((QString *)0x2441db);
    QString::~QString((QString *)0x2441e5);
    QString::~QString((QString *)0x2441ef);
    QList<QString>::~QList((QList<QString> *)0x2441fc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output attrTagX(const char *name, const QStringList &v, const char *s = ",")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(name));
    return tagValue(name, temp.join(s));
}